

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathexpander.cpp
# Opt level: O3

FileReader * __thiscall PathExpander::openFileReader(PathExpander *this,char *name,int *plumpnum)

{
  bool bVar1;
  int iVar2;
  FWadLump *this_00;
  long lVar3;
  FString current_filename;
  FString local_48;
  FString local_40;
  int *local_38;
  
  local_48.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  if ((name != (char *)0x0) && (*name != '\0')) {
    FString::operator=(&local_48,name);
    FString::ReplaceChars(&local_48,'\\','/');
    if (this->openmode != 2) {
      iVar2 = FWadCollection::CheckNumForFullName(&Wads,local_48.Chars,false,0);
      if (-1 < iVar2) {
        this_00 = FWadCollection::ReopenLumpNum(&Wads,iVar2);
        if (plumpnum != (int *)0x0) {
          *plumpnum = iVar2;
        }
        goto LAB_003ac6b6;
      }
      if (this->openmode == 1) {
        this_00 = (FWadLump *)0x0;
        lVar3 = (ulong)(this->PathList).Count * 8 + -8;
        local_38 = plumpnum;
        do {
          if (lVar3 + -8 == -0x10) goto LAB_003ac6b6;
          BuildPath(&local_40,(char *)((long)&((this->PathList).Array)->Chars + lVar3));
          FString::operator=(&local_48,&local_40);
          FString::~FString(&local_40);
          iVar2 = FWadCollection::CheckNumForFullName(&Wads,local_48.Chars,false,0);
          lVar3 = lVar3 + -8;
        } while (iVar2 < 0);
        this_00 = FWadCollection::ReopenLumpNum(&Wads,iVar2);
        if (local_38 != (int *)0x0) {
          *local_38 = iVar2;
        }
        goto LAB_003ac6b6;
      }
    }
    if (plumpnum != (int *)0x0) {
      *plumpnum = -1;
    }
    this_00 = (FWadLump *)operator_new(0x30);
    FileReader::FileReader((FileReader *)this_00);
    bVar1 = FileReader::Open((FileReader *)this_00,local_48.Chars);
    if (bVar1) goto LAB_003ac6b6;
    if (*name != '/') {
      lVar3 = (ulong)(this->PathList).Count * 8 + -8;
      do {
        if (lVar3 + -8 == -0x10) goto LAB_003ac6aa;
        BuildPath(&local_40,(char *)((long)&((this->PathList).Array)->Chars + lVar3));
        FString::operator=(&local_48,&local_40);
        FString::~FString(&local_40);
        bVar1 = FileReader::Open((FileReader *)this_00,local_48.Chars);
        lVar3 = lVar3 + -8;
      } while (!bVar1);
      goto LAB_003ac6b6;
    }
LAB_003ac6aa:
    (*(this_00->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])(this_00);
  }
  this_00 = (FWadLump *)0x0;
LAB_003ac6b6:
  FString::~FString(&local_48);
  return &this_00->super_FileReader;
}

Assistant:

void PathExpander::clearPathlist()
{
	PathList.Clear();
}